

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int iVar1;
  undefined1 auVar2 [16];
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar4;
  type piVar5;
  type pfVar6;
  type prVar7;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  float fVar8;
  float fVar9;
  float a;
  type *last;
  type *first;
  float local_30;
  int local_2c;
  float sum_a_pi_p;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  *this_local;
  
  local_2c = 0;
  _sum_a_pi_p = x;
  x_local = (bit_array *)end;
  begin_local = (row_iterator)this;
  for (end_local = begin; end_local != (row_iterator)x_local; end_local = end_local + 1) {
    local_30 = 0.0;
    sparse_matrix<int>::column((sparse_matrix<int> *)&first,(int)this + 0x10);
    ppcVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    ppcVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                          *)&first);
    while (iVar1 = local_2c, *ppcVar3 != *ppcVar4) {
      this_00 = &this->A;
      piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         (this_00,(long)(*ppcVar3)->value);
      fVar8 = (float)*piVar5;
      std::abs((int)this_00);
      pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar3)->row);
      fVar9 = *pfVar6;
      pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->P,(long)(*ppcVar3)->value);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 + *pfVar6)),ZEXT416((uint)fVar8),
                               ZEXT416((uint)local_30));
      local_30 = auVar2._0_4_;
      *ppcVar3 = *ppcVar3 + 1;
    }
    prVar7 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar7->id = iVar1;
    piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->A,(long)end_local->value);
    iVar1 = *piVar5;
    prVar7 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar7->f = iVar1;
    fVar9 = default_cost_type<float>::operator()(this->c,end_local->column,_sum_a_pi_p);
    fVar9 = fVar9 - local_30;
    prVar7 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar7->value = fVar9;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }